

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O2

CURLSHcode curl_share_setopt(CURLSH *sh,CURLSHoption option,...)

{
  byte bVar1;
  CURLSHcode CVar2;
  CURLcode CVar3;
  CookieInfo *pCVar4;
  va_list param;
  undefined8 local_b8;
  
  if (sh == (CURLSH *)0x0) {
    return CURLSHE_INVALID;
  }
  if (*sh != 0x7e117a1e) {
    return CURLSHE_INVALID;
  }
  if (*(int *)((long)sh + 8) != 0) {
    return CURLSHE_IN_USE;
  }
  CVar2 = CURLSHE_BAD_OPTION;
  switch(option) {
  case CURLSHOPT_SHARE:
    switch((undefined4)local_b8) {
    case 2:
      if (*(long *)((long)sh + 0xd0) == 0) {
        pCVar4 = Curl_cookie_init((Curl_easy *)0x0,(char *)0x0,(CookieInfo *)0x0,true);
        *(CookieInfo **)((long)sh + 0xd0) = pCVar4;
LAB_001519ab:
        if (pCVar4 == (CookieInfo *)0x0) {
          return CURLSHE_NOMEM;
        }
      }
      break;
    case 3:
    case 6:
      break;
    case 4:
      if ((*(long *)((long)sh + 0xf8) == 0) &&
         (CVar3 = Curl_ssl_scache_create(0x19,2,(Curl_ssl_scache **)((long)sh + 0xf8)),
         CVar3 != CURLE_OK)) {
        return CURLSHE_NOMEM;
      }
      break;
    case 5:
      if ((*(byte *)((long)sh + 0x98) & 2) == 0) {
        Curl_cpool_init((cpool *)((long)sh + 0x30),*(Curl_easy **)((long)sh + 0x28),(Curl_share *)sh
                        ,0x67);
      }
      break;
    case 7:
      if (*(long *)((long)sh + 0xf0) == 0) {
        pCVar4 = (CookieInfo *)Curl_hsts_init();
        *(CookieInfo **)((long)sh + 0xf0) = pCVar4;
        goto LAB_001519ab;
      }
      break;
    default:
      goto switchD_001517af_default;
    }
    *(uint *)((long)sh + 4) = *(uint *)((long)sh + 4) | 1 << ((byte)local_b8 & 0x1f);
    break;
  case CURLSHOPT_UNSHARE:
    bVar1 = (byte)local_b8 & 0x1f;
    *(uint *)((long)sh + 4) = *(uint *)((long)sh + 4) & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
    switch((undefined4)local_b8) {
    case 2:
      if (*(CookieInfo **)((long)sh + 0xd0) != (CookieInfo *)0x0) {
        Curl_cookie_cleanup(*(CookieInfo **)((long)sh + 0xd0));
        *(undefined8 *)((long)sh + 0xd0) = 0;
      }
      break;
    case 3:
    case 5:
      break;
    case 4:
      if (*(Curl_ssl_scache **)((long)sh + 0xf8) != (Curl_ssl_scache *)0x0) {
        Curl_ssl_scache_destroy(*(Curl_ssl_scache **)((long)sh + 0xf8));
        *(undefined8 *)((long)sh + 0xf8) = 0;
      }
      break;
    default:
      goto switchD_001517af_default;
    case 7:
      if (*(long *)((long)sh + 0xf0) != 0) {
        Curl_hsts_cleanup((hsts **)((long)sh + 0xf0));
      }
    }
    break;
  case CURLSHOPT_LOCKFUNC:
    *(undefined8 *)((long)sh + 0x10) = local_b8;
    break;
  case CURLSHOPT_UNLOCKFUNC:
    *(undefined8 *)((long)sh + 0x18) = local_b8;
    break;
  case CURLSHOPT_USERDATA:
    *(undefined8 *)((long)sh + 0x20) = local_b8;
    break;
  default:
    goto switchD_001517af_default;
  }
  CVar2 = CURLSHE_OK;
switchD_001517af_default:
  return CVar2;
}

Assistant:

CURLSHcode
curl_share_setopt(CURLSH *sh, CURLSHoption option, ...)
{
  va_list param;
  int type;
  curl_lock_function lockfunc;
  curl_unlock_function unlockfunc;
  void *ptr;
  CURLSHcode res = CURLSHE_OK;
  struct Curl_share *share = sh;

  if(!GOOD_SHARE_HANDLE(share))
    return CURLSHE_INVALID;

  if(share->dirty)
    /* do not allow setting options while one or more handles are already
       using this share */
    return CURLSHE_IN_USE;

  va_start(param, option);

  switch(option) {
  case CURLSHOPT_SHARE:
    /* this is a type this share will share */
    type = va_arg(param, int);

    switch(type) {
    case CURL_LOCK_DATA_DNS:
      break;

    case CURL_LOCK_DATA_COOKIE:
#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_COOKIES)
      if(!share->cookies) {
        share->cookies = Curl_cookie_init(NULL, NULL, NULL, TRUE);
        if(!share->cookies)
          res = CURLSHE_NOMEM;
      }
#else   /* CURL_DISABLE_HTTP */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_HSTS:
#ifndef CURL_DISABLE_HSTS
      if(!share->hsts) {
        share->hsts = Curl_hsts_init();
        if(!share->hsts)
          res = CURLSHE_NOMEM;
      }
#else   /* CURL_DISABLE_HSTS */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_SSL_SESSION:
#ifdef USE_SSL
      if(!share->ssl_scache) {
        /* There is no way (yet) for the application to configure the
         * session cache size, shared between many transfers. As for curl
         * itself, a high session count will impact startup time. Also, the
         * scache is not optimized for several hundreds of peers. So,
         * keep it at a reasonable level. */
        if(Curl_ssl_scache_create(25, 2, &share->ssl_scache))
          res = CURLSHE_NOMEM;
      }
#else
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_CONNECT:
      /* It is safe to set this option several times on a share. */
      if(!share->cpool.initialised) {
        Curl_cpool_init(&share->cpool, share->admin, share, 103);
      }
      break;

    case CURL_LOCK_DATA_PSL:
#ifndef USE_LIBPSL
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    default:
      res = CURLSHE_BAD_OPTION;
    }
    if(!res)
      share->specifier |= (unsigned int)(1 << type);
    break;

  case CURLSHOPT_UNSHARE:
    /* this is a type this share will no longer share */
    type = va_arg(param, int);
    share->specifier &= ~(unsigned int)(1 << type);
    switch(type) {
    case CURL_LOCK_DATA_DNS:
      break;

    case CURL_LOCK_DATA_COOKIE:
#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_COOKIES)
      if(share->cookies) {
        Curl_cookie_cleanup(share->cookies);
        share->cookies = NULL;
      }
#else   /* CURL_DISABLE_HTTP */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_HSTS:
#ifndef CURL_DISABLE_HSTS
      if(share->hsts) {
        Curl_hsts_cleanup(&share->hsts);
      }
#else   /* CURL_DISABLE_HSTS */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_SSL_SESSION:
#ifdef USE_SSL
      if(share->ssl_scache) {
        Curl_ssl_scache_destroy(share->ssl_scache);
        share->ssl_scache = NULL;
      }
#else
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_CONNECT:
      break;

    default:
      res = CURLSHE_BAD_OPTION;
      break;
    }
    break;

  case CURLSHOPT_LOCKFUNC:
    lockfunc = va_arg(param, curl_lock_function);
    share->lockfunc = lockfunc;
    break;

  case CURLSHOPT_UNLOCKFUNC:
    unlockfunc = va_arg(param, curl_unlock_function);
    share->unlockfunc = unlockfunc;
    break;

  case CURLSHOPT_USERDATA:
    ptr = va_arg(param, void *);
    share->clientdata = ptr;
    break;

  default:
    res = CURLSHE_BAD_OPTION;
    break;
  }

  va_end(param);

  return res;
}